

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

size_t __thiscall ktx::ValidationContext::calcLayerSize(ValidationContext *this,uint32_t level)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  byte in_SIL;
  optional<unsigned_char> *in_RDI;
  size_t imageSize;
  uint blockCountZ;
  uint blockDimensionZ;
  uint levelDepth;
  bool *__u;
  uint local_18 [6];
  
  local_18[1] = 1;
  local_18[0] = *(uint *)(in_RDI + 0x2a) >> (in_SIL & 0x1f);
  puVar2 = std::max<unsigned_int>(local_18 + 1,local_18);
  local_18[2] = *puVar2;
  __u = &in_RDI[0x62].super__Optional_base<unsigned_char,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_char>._M_engaged;
  std::optional<unsigned_char>::value_or<unsigned_int>(in_RDI,(uint *)__u);
  std::optional<unsigned_char>::value_or<unsigned_char>(in_RDI,__u);
  uVar1 = ceil_div<unsigned_int>(0,0x2b57e7);
  sVar3 = calcImageSize(_blockCountZ,imageSize._4_4_);
  return sVar3 * uVar1 * (ulong)*(uint *)(in_RDI + 0x2e);
}

Assistant:

size_t ValidationContext::calcLayerSize(uint32_t level) {
    const auto levelDepth = std::max(1u, header.pixelDepth >> level);
    const auto blockDimensionZ = 1u + expectedBlockDimension2.value_or(parsedBlockDimension2.value_or(0u));
    const auto blockCountZ = ceil_div(levelDepth, blockDimensionZ);

    const auto imageSize = calcImageSize(level);
    // As there are no 3D cubemaps, the image's z block count will always be 1 for
    // cubemaps and numFaces will always be 1 for 3D textures so the multiplication is safe.
    // 3D cubemaps, if they existed, would require imageSize * (blockCount.z + This->numFaces);
    return imageSize * blockCountZ * header.faceCount;
}